

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

RemotePromise<capnp::AnyPointer> * __thiscall
capnp::LocalRequest::sendImpl
          (RemotePromise<capnp::AnyPointer> *__return_storage_ptr__,LocalRequest *this,
          bool isStreaming)

{
  uint *puVar1;
  ushort uVar2;
  uint64_t uVar3;
  ClientHook *pCVar4;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:271:52),_void>
  PVar5;
  PipelineHook *pPVar6;
  bool isStreaming_local;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:271:52),_void>
  promise;
  DebugComparison<capnp::MallocMessageBuilder_*,_std::nullptr_t> _kjCondition;
  Own<capnp::LocalCallContext,_std::nullptr_t> context;
  VoidPromiseAndPipeline promiseAndPipeline;
  
  _kjCondition.left = (this->message).ptr;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left != (MallocMessageBuilder *)0x0;
  isStreaming_local = isStreaming;
  if (_kjCondition.left != (MallocMessageBuilder *)0x0) {
    (*((this->client).ptr)->_vptr_ClientHook[4])(&_kjCondition);
    kj::
    refcounted<capnp::LocalCallContext,kj::Own<capnp::MallocMessageBuilder,decltype(nullptr)>,kj::Own<capnp::ClientHook,decltype(nullptr)>,capnp::Capability::Client::CallHints&,bool&>
              ((kj *)&context,&this->message,(Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition
               ,&this->hints,&isStreaming_local);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
    uVar3 = this->interfaceId;
    pCVar4 = (this->client).ptr;
    uVar2 = this->methodId;
    promise.super_PromiseBase.node.ptr = (PromiseBase)&(context.ptr)->super_Refcounted;
    puVar1 = &((context.ptr)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    _kjCondition.right = context.ptr;
    _kjCondition.left = (MallocMessageBuilder *)promise.super_PromiseBase.node.ptr;
    (*pCVar4->_vptr_ClientHook[1])
              (&promiseAndPipeline,pCVar4,uVar3,(ulong)uVar2,&_kjCondition,
               (ulong)(ushort)this->hints);
    kj::Own<capnp::CallContextHook,_std::nullptr_t>::dispose
              ((Own<capnp::CallContextHook,_std::nullptr_t> *)&_kjCondition);
    kj::Own<capnp::LocalCallContext,_std::nullptr_t>::dispose
              ((Own<capnp::LocalCallContext,_std::nullptr_t> *)&promise);
    _kjCondition.left = (MallocMessageBuilder *)context.disposer;
    _kjCondition.right = context.ptr;
    context.ptr = (LocalCallContext *)0x0;
    kj::Promise<void>::then<capnp::LocalRequest::sendImpl(bool)::_lambda()_1_>
              ((Promise<void> *)&promise,(anon_class_16_1_bc11688f_for_func *)&promiseAndPipeline);
    kj::Own<capnp::LocalCallContext,_std::nullptr_t>::dispose
              ((Own<capnp::LocalCallContext,_std::nullptr_t> *)&_kjCondition);
    pPVar6 = promiseAndPipeline.pipeline.ptr;
    PVar5 = promise;
    promiseAndPipeline.pipeline.ptr = (PipelineHook *)0x0;
    _kjCondition.left = (MallocMessageBuilder *)promiseAndPipeline.pipeline.disposer;
    _kjCondition.result = false;
    _kjCondition._33_7_ = 0;
    promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    (__return_storage_ptr__->super_Promise<capnp::Response<capnp::AnyPointer>_>).super_PromiseBase.
    node.ptr = (PromiseNode *)PVar5.super_PromiseBase.node.ptr;
    _kjCondition.right = (void *)0x0;
    (__return_storage_ptr__->super_Pipeline).hook.disposer = promiseAndPipeline.pipeline.disposer;
    (__return_storage_ptr__->super_Pipeline).hook.ptr = pPVar6;
    (__return_storage_ptr__->super_Pipeline).ops.ptr = (PipelineOp *)0x0;
    (__return_storage_ptr__->super_Pipeline).ops.size_ = 0;
    (__return_storage_ptr__->super_Pipeline).ops.disposer = (ArrayDisposer *)0x0;
    _kjCondition.op.content.ptr = (char *)0x0;
    _kjCondition.op.content.size_ = 0;
    AnyPointer::Pipeline::~Pipeline((Pipeline *)&_kjCondition);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
    ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline(&promiseAndPipeline);
    kj::Own<capnp::LocalCallContext,_std::nullptr_t>::dispose(&context);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::MallocMessageBuilder*,decltype(nullptr)>&,char_const(&)[39]>
            ((Fault *)&promiseAndPipeline,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x109,FAILED,"message.get() != nullptr",
             "_kjCondition,\"Already called send() on this request.\"",&_kjCondition,
             (char (*) [39])"Already called send() on this request.");
  kj::_::Debug::Fault::fatal((Fault *)&promiseAndPipeline);
}

Assistant:

RemotePromise<AnyPointer> sendImpl(bool isStreaming) {
    KJ_REQUIRE(message.get() != nullptr, "Already called send() on this request.");

    auto context = kj::refcounted<LocalCallContext>(kj::mv(message), client->addRef(), hints, isStreaming);
    auto promiseAndPipeline = client->call(interfaceId, methodId, kj::addRef(*context), hints);

    // Now the other branch returns the response from the context.
    auto promise = promiseAndPipeline.promise.then([context=kj::mv(context)]() mutable {
      // force response allocation
      auto reader = context->getResults(MessageSize { 0, 0 }).asReader();

      if (context->isShared()) {
        // We can't just move away context->response as `context` itself is still referenced by
        // something -- probably a Pipeline object. As a bit of a hack, LocalCallContext itself
        // implements ResponseHook so that we can just return a ref on it.
        //
        // TODO(cleanup): Maybe ResponseHook should be refcounted? Note that context->response
        //   might not necessarily contain a LocalResponse if it was resolved by a tail call, so
        //   we'd have to add refcounting to all ResponseHook implementations.
        context->releaseParams();      // The call is done so params can definitely be dropped.
        context->clientRef = nullptr;  // Definitely not using the client cap anymore either.
        return Response<AnyPointer>(reader, kj::mv(context));
      } else {
        return kj::mv(KJ_ASSERT_NONNULL(context->response));
      }
    });

    // We return the other branch.
    return RemotePromise<AnyPointer>(
        kj::mv(promise), AnyPointer::Pipeline(kj::mv(promiseAndPipeline.pipeline)));
  }